

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::analyze_image_and_sampler_usage(Compiler *this)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  SPIRFunction *pSVar3;
  size_type sVar4;
  long lVar5;
  key_type local_104;
  CombinedImageSamplerDrefHandler dref_handler;
  CombinedImageSamplerUsageHandler handler;
  
  dref_handler.dref_combined_samplers._M_h._M_buckets =
       &dref_handler.dref_combined_samplers._M_h._M_single_bucket;
  dref_handler.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerDrefHandler_00465658;
  dref_handler.dref_combined_samplers._M_h._M_bucket_count = 1;
  dref_handler.dref_combined_samplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dref_handler.dref_combined_samplers._M_h._M_element_count = 0;
  dref_handler.dref_combined_samplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  dref_handler.dref_combined_samplers._M_h._M_rehash_policy._M_next_resize = 0;
  dref_handler.dref_combined_samplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  dref_handler.compiler = this;
  pSVar3 = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&dref_handler.super_OpcodeHandler);
  handler.dref_combined_samplers = &dref_handler.dref_combined_samplers;
  handler.dependency_hierarchy._M_h._M_buckets = &handler.dependency_hierarchy._M_h._M_single_bucket
  ;
  handler.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerUsageHandler_004656c8;
  handler.dependency_hierarchy._M_h._M_bucket_count = 1;
  handler.dependency_hierarchy._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handler.dependency_hierarchy._M_h._M_element_count = 0;
  handler.dependency_hierarchy._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handler.dependency_hierarchy._M_h._M_rehash_policy._M_next_resize = 0;
  handler.dependency_hierarchy._M_h._M_single_bucket = (__node_base_ptr)0x0;
  handler.comparison_ids._M_h._M_buckets = &handler.comparison_ids._M_h._M_single_bucket;
  handler.comparison_ids._M_h._M_bucket_count = 1;
  handler.comparison_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handler.comparison_ids._M_h._M_element_count = 0;
  handler.comparison_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handler.comparison_ids._M_h._M_rehash_policy._M_next_resize = 0;
  handler.comparison_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  handler.need_subpass_input = false;
  handler.need_subpass_input_ms = false;
  handler.compiler = this;
  pSVar3 = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&handler.super_OpcodeHandler);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&handler.dependency_hierarchy._M_h);
  pSVar3 = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&handler.super_OpcodeHandler);
  this_00 = &this->comparison_ids;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&this_00->_M_h,&handler.comparison_ids._M_h);
  this->need_subpass_input = handler.need_subpass_input;
  this->need_subpass_input_ms = handler.need_subpass_input_ms;
  pCVar1 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  for (lVar5 = 0; sVar2 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
    local_104 = *(key_type *)((long)&(pCVar1->sampler_id).id + lVar5);
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,&local_104);
    if (sVar4 != 0) {
      local_104 = *(key_type *)((long)&(pCVar1->combined_id).id + lVar5);
      ::std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)this_00,&local_104);
    }
  }
  CombinedImageSamplerUsageHandler::~CombinedImageSamplerUsageHandler(&handler);
  CombinedImageSamplerDrefHandler::~CombinedImageSamplerDrefHandler(&dref_handler);
  return;
}

Assistant:

void Compiler::analyze_image_and_sampler_usage()
{
	CombinedImageSamplerDrefHandler dref_handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), dref_handler);

	CombinedImageSamplerUsageHandler handler(*this, dref_handler.dref_combined_samplers);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Need to run this traversal twice. First time, we propagate any comparison sampler usage from leaf functions
	// down to main().
	// In the second pass, we can propagate up forced depth state coming from main() up into leaf functions.
	handler.dependency_hierarchy.clear();
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	comparison_ids = std::move(handler.comparison_ids);
	need_subpass_input = handler.need_subpass_input;
	need_subpass_input_ms = handler.need_subpass_input_ms;

	// Forward information from separate images and samplers into combined image samplers.
	for (auto &combined : combined_image_samplers)
		if (comparison_ids.count(combined.sampler_id))
			comparison_ids.insert(combined.combined_id);
}